

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall
glslang::HlslGrammar::acceptSimpleStatement(HlslGrammar *this,TIntermNode **statement)

{
  bool bVar1;
  TIntermTyped *local_28;
  TIntermTyped *node;
  TIntermNode **statement_local;
  HlslGrammar *this_local;
  
  node = (TIntermTyped *)statement;
  statement_local = (TIntermNode **)this;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = acceptDeclaration(this,(TIntermNode **)node);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      bVar1 = acceptExpression(this,&local_28);
      if (bVar1) {
        (node->super_TIntermNode)._vptr_TIntermNode = (_func_int **)local_28;
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
        if (bVar1) {
          this_local._7_1_ = true;
        }
        else {
          expected(this,";");
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptSimpleStatement(TIntermNode*& statement)
{
    // SEMICOLON
    if (acceptTokenClass(EHTokSemicolon))
        return true;

    // declaration
    if (acceptDeclaration(statement))
        return true;

    // expression
    TIntermTyped* node;
    if (acceptExpression(node))
        statement = node;
    else
        return false;

    // SEMICOLON (following an expression)
    if (acceptTokenClass(EHTokSemicolon))
        return true;
    else {
        expected(";");
        return false;
    }
}